

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_interface_block(CompilerMSL *this,uint32_t ib_var_id)

{
  SPIRVariable *var;
  SPIRType *type;
  
  if (ib_var_id == 0) {
    return;
  }
  var = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ib_var_id);
  type = Compiler::get_variable_data_type((Compiler *)this,var);
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    CompilerGLSL::emit_struct(&this->super_CompilerGLSL,type);
    return;
  }
  __assert_fail("ib_type.basetype == SPIRType::Struct",
                "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                ,0x26e7,"void spirv_cross::CompilerMSL::emit_interface_block(uint32_t)");
}

Assistant:

void CompilerMSL::emit_interface_block(uint32_t ib_var_id)
{
	if (ib_var_id)
	{
		auto &ib_var = get<SPIRVariable>(ib_var_id);
		auto &ib_type = get_variable_data_type(ib_var);
		//assert(ib_type.basetype == SPIRType::Struct && !ib_type.member_types.empty());
		assert(ib_type.basetype == SPIRType::Struct);
		emit_struct(ib_type);
	}
}